

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasLazyFields
               (FileDescriptor *file,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  int iVar2;
  Descriptor *descriptor_00;
  FieldDescriptor *field;
  int local_3c;
  int field_idx;
  Descriptor *descriptor;
  int i;
  MessageSCCAnalyzer *scc_analyzer_local;
  Options *options_local;
  FileDescriptor *file_local;
  
  descriptor._4_4_ = 0;
  while( true ) {
    iVar2 = FileDescriptor::message_type_count(file);
    if (iVar2 <= descriptor._4_4_) {
      local_3c = 0;
      while( true ) {
        iVar2 = FileDescriptor::extension_count(file);
        if (iVar2 <= local_3c) {
          return false;
        }
        field = FileDescriptor::extension(file,local_3c);
        bVar1 = IsLazy(field,options,scc_analyzer);
        if (bVar1) break;
        local_3c = local_3c + 1;
      }
      return true;
    }
    descriptor_00 = FileDescriptor::message_type(file,descriptor._4_4_);
    bVar1 = HasLazyFields(descriptor_00,options,scc_analyzer);
    if (bVar1) break;
    descriptor._4_4_ = descriptor._4_4_ + 1;
  }
  return true;
}

Assistant:

bool HasLazyFields(const FileDescriptor* file, const Options& options,
                   MessageSCCAnalyzer* scc_analyzer) {
  for (int i = 0; i < file->message_type_count(); i++) {
    const Descriptor* descriptor(file->message_type(i));
    if (HasLazyFields(descriptor, options, scc_analyzer)) {
      return true;
    }
  }
  for (int field_idx = 0; field_idx < file->extension_count(); field_idx++) {
    if (IsLazy(file->extension(field_idx), options, scc_analyzer)) {
      return true;
    }
  }
  return false;
}